

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_ecdsa_recover
              (secp256k1_context *ctx,secp256k1_pubkey *pubkey,
              secp256k1_ecdsa_recoverable_signature *signature,uchar *msghash32)

{
  byte bVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined4 extraout_EAX;
  int iVar7;
  undefined4 extraout_EAX_00;
  ulong uVar8;
  uchar *a;
  secp256k1_pubkey *bin;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  secp256k1_scalar r;
  secp256k1_scalar s;
  secp256k1_fe fx;
  secp256k1_scalar m;
  uchar brx [32];
  secp256k1_scalar u2;
  secp256k1_scalar u1;
  secp256k1_scalar rn;
  secp256k1_ge x;
  secp256k1_gej xj;
  secp256k1_ge q;
  secp256k1_fe aux [8];
  secp256k1_ge pre_a [8];
  secp256k1_fe sStack_c98;
  secp256k1_ge sStack_c68;
  secp256k1_pubkey *psStack_c00;
  code *pcStack_bf0;
  ulong local_be8;
  ulong local_be0;
  secp256k1_scalar local_bd8;
  secp256k1_scalar local_bb8;
  undefined1 local_b90 [80];
  secp256k1_strauss_state local_b40;
  undefined1 local_b28 [72];
  secp256k1_scalar local_ae0;
  secp256k1_scalar local_ac0;
  secp256k1_ge local_aa0;
  secp256k1_gej local_a38;
  secp256k1_gej local_9a0;
  secp256k1_strauss_point_state local_908;
  secp256k1_fe local_4f8 [8];
  secp256k1_ge local_378 [8];
  
  if (ctx == (secp256k1_context *)0x0) {
    pcStack_bf0 = (code *)0x11ebeb;
    secp256k1_ecdsa_recover_cold_6();
  }
  else if (msghash32 != (uchar *)0x0) {
    if (signature == (secp256k1_ecdsa_recoverable_signature *)0x0) {
      pcStack_bf0 = (code *)0x11ebf7;
      secp256k1_ecdsa_recover_cold_4();
      return 0;
    }
    if (pubkey == (secp256k1_pubkey *)0x0) {
      pcStack_bf0 = (code *)0x11ebfe;
      secp256k1_ecdsa_recover_cold_3();
      return 0;
    }
    local_bd8.d[0] = *(uint64_t *)signature->data;
    local_bd8.d[1] = *(uint64_t *)(signature->data + 8);
    local_bd8.d[2] = *(uint64_t *)(signature->data + 0x10);
    local_bd8.d[3] = *(uint64_t *)(signature->data + 0x18);
    local_bb8.d[0] = *(uint64_t *)(signature->data + 0x20);
    local_bb8.d[1] = *(uint64_t *)(signature->data + 0x28);
    local_bb8.d[2] = *(uint64_t *)(signature->data + 0x30);
    local_bb8.d[3] = *(uint64_t *)(signature->data + 0x38);
    bVar1 = signature->data[0x40];
    uVar8 = (ulong)bVar1;
    if (bVar1 < 4) {
      pcStack_bf0 = (code *)0x11e901;
      secp256k1_scalar_set_b32((secp256k1_scalar *)(local_b90 + 0x30),msghash32,(int *)0x0);
      pcStack_bf0 = (code *)0x11e90e;
      secp256k1_scalar_verify(&local_bd8);
      auVar9._0_4_ = -(uint)((int)local_bd8.d[0] == 0 && (int)local_bd8.d[2] == 0);
      auVar9._4_4_ = -(uint)(local_bd8.d[0]._4_4_ == 0 && local_bd8.d[2]._4_4_ == 0);
      auVar9._8_4_ = -(uint)((int)local_bd8.d[1] == 0 && (int)local_bd8.d[3] == 0);
      auVar9._12_4_ = -(uint)(local_bd8.d[1]._4_4_ == 0 && local_bd8.d[3]._4_4_ == 0);
      iVar7 = movmskps(extraout_EAX,auVar9);
      if (iVar7 != 0xf) {
        pcStack_bf0 = (code *)0x11e93a;
        secp256k1_scalar_verify(&local_bb8);
        auVar10._0_4_ = -(uint)((int)local_bb8.d[0] == 0 && (int)local_bb8.d[2] == 0);
        auVar10._4_4_ = -(uint)(local_bb8.d[0]._4_4_ == 0 && local_bb8.d[2]._4_4_ == 0);
        auVar10._8_4_ = -(uint)((int)local_bb8.d[1] == 0 && (int)local_bb8.d[3] == 0);
        auVar10._12_4_ = -(uint)(local_bb8.d[1]._4_4_ == 0 && local_bb8.d[3]._4_4_ == 0);
        iVar7 = movmskps(extraout_EAX_00,auVar10);
        if (iVar7 != 0xf) {
          bin = (secp256k1_pubkey *)local_b28;
          pcStack_bf0 = (code *)0x11e96e;
          secp256k1_scalar_get_b32((uchar *)bin,&local_bd8);
          ctx = (secp256k1_context *)local_b90;
          pcStack_bf0 = (code *)0x11e97e;
          secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)ctx,(uchar *)bin);
          uVar6 = local_b90._32_8_;
          uVar5 = local_b90._24_8_;
          uVar4 = local_b90._8_8_;
          uVar3 = local_b90._0_8_;
          if (((0xffffefffffc2e < (ulong)local_b90._0_8_) && (local_b90._32_8_ == 0xffffffffffff))
             && ((local_b90._16_8_ & local_b90._24_8_ & local_b90._8_8_) == 0xfffffffffffff))
          goto LAB_0011ec05;
          local_be0 = local_b90._16_8_;
          local_b90._40_8_ = 0x100000001;
          pcStack_bf0 = (code *)0x11e9e8;
          secp256k1_fe_verify((secp256k1_fe *)local_b90);
          if (bVar1 < 2) {
LAB_0011eab3:
            pcStack_bf0 = (code *)0x11eaca;
            iVar7 = secp256k1_ge_set_xo_var(&local_aa0,(secp256k1_fe *)local_b90,bVar1 & 1);
            if (iVar7 != 0) {
              pcStack_bf0 = (code *)0x11eaea;
              secp256k1_gej_set_ge(&local_9a0,&local_aa0);
              pcStack_bf0 = (code *)0x11eaff;
              secp256k1_scalar_inverse_var(&local_ac0,&local_bd8);
              pcStack_bf0 = (code *)0x11eb1a;
              secp256k1_scalar_mul(&local_ae0,&local_ac0,(secp256k1_scalar *)(local_b90 + 0x30));
              pcStack_bf0 = (code *)0x11eb25;
              secp256k1_scalar_negate(&local_ae0,&local_ae0);
              pcStack_bf0 = (code *)0x11eb3d;
              secp256k1_scalar_mul((secp256k1_scalar *)(local_b28 + 0x28),&local_ac0,&local_bb8);
              local_b40.aux = local_4f8;
              local_b40.pre_a = local_378;
              local_b40.ps = &local_908;
              pcStack_bf0 = (code *)0x11eb86;
              secp256k1_ecmult_strauss_wnaf
                        (&local_b40,&local_a38,1,&local_9a0,(secp256k1_scalar *)(local_b28 + 0x28),
                         &local_ae0);
              pcStack_bf0 = (code *)0x11eb96;
              secp256k1_ge_set_gej_var((secp256k1_ge *)&local_908,&local_a38);
              pcStack_bf0 = (code *)0x11eb9e;
              secp256k1_gej_verify(&local_a38);
              if (local_a38.infinity == 0) {
                pcStack_bf0 = (code *)0x11ebdf;
                secp256k1_ge_to_bytes(pubkey->data,(secp256k1_ge *)&local_908);
                return 1;
              }
            }
          }
          else {
            local_be8 = uVar5;
            pcStack_bf0 = (code *)0x11ea00;
            secp256k1_fe_verify((secp256k1_fe *)local_b90);
            pcStack_bf0 = (code *)0x11ea0f;
            secp256k1_fe_verify(&secp256k1_ecdsa_const_p_minus_order);
            uVar8 = 4;
            do {
              iVar7 = (int)uVar8;
              uVar2 = secp256k1_ecdsa_const_p_minus_order.n[uVar8];
              uVar8 = *(ulong *)(local_b90 + uVar8 * 8);
              if (uVar8 >= uVar2 && uVar8 != uVar2) break;
              if (uVar8 < uVar2) {
                pcStack_bf0 = (code *)0x11ea3e;
                secp256k1_fe_verify((secp256k1_fe *)local_b90);
                pcStack_bf0 = (code *)0x11ea4a;
                secp256k1_fe_verify(&secp256k1_ecdsa_const_order_as_fe);
                local_b90._0_8_ = uVar3 + 0x25e8cd0364141;
                local_b90._8_8_ = uVar4 + 0xe6af48a03bbfd;
                local_b90._16_8_ = local_be0 + 0xffffffebaaedc;
                local_b90._24_8_ = local_be8 + 0xfffffffffffff;
                local_b90._32_8_ = uVar6 + 0xffffffffffff;
                local_b90._40_8_ = 2;
                pcStack_bf0 = (code *)0x11eab3;
                secp256k1_fe_verify((secp256k1_fe *)local_b90);
                goto LAB_0011eab3;
              }
              uVar8 = (ulong)(iVar7 - 1);
            } while (iVar7 != 0);
          }
        }
      }
      pubkey->data[0x30] = '\0';
      pubkey->data[0x31] = '\0';
      pubkey->data[0x32] = '\0';
      pubkey->data[0x33] = '\0';
      pubkey->data[0x34] = '\0';
      pubkey->data[0x35] = '\0';
      pubkey->data[0x36] = '\0';
      pubkey->data[0x37] = '\0';
      pubkey->data[0x38] = '\0';
      pubkey->data[0x39] = '\0';
      pubkey->data[0x3a] = '\0';
      pubkey->data[0x3b] = '\0';
      pubkey->data[0x3c] = '\0';
      pubkey->data[0x3d] = '\0';
      pubkey->data[0x3e] = '\0';
      pubkey->data[0x3f] = '\0';
      pubkey->data[0x20] = '\0';
      pubkey->data[0x21] = '\0';
      pubkey->data[0x22] = '\0';
      pubkey->data[0x23] = '\0';
      pubkey->data[0x24] = '\0';
      pubkey->data[0x25] = '\0';
      pubkey->data[0x26] = '\0';
      pubkey->data[0x27] = '\0';
      pubkey->data[0x28] = '\0';
      pubkey->data[0x29] = '\0';
      pubkey->data[0x2a] = '\0';
      pubkey->data[0x2b] = '\0';
      pubkey->data[0x2c] = '\0';
      pubkey->data[0x2d] = '\0';
      pubkey->data[0x2e] = '\0';
      pubkey->data[0x2f] = '\0';
      pubkey->data[0x10] = '\0';
      pubkey->data[0x11] = '\0';
      pubkey->data[0x12] = '\0';
      pubkey->data[0x13] = '\0';
      pubkey->data[0x14] = '\0';
      pubkey->data[0x15] = '\0';
      pubkey->data[0x16] = '\0';
      pubkey->data[0x17] = '\0';
      pubkey->data[0x18] = '\0';
      pubkey->data[0x19] = '\0';
      pubkey->data[0x1a] = '\0';
      pubkey->data[0x1b] = '\0';
      pubkey->data[0x1c] = '\0';
      pubkey->data[0x1d] = '\0';
      pubkey->data[0x1e] = '\0';
      pubkey->data[0x1f] = '\0';
      pubkey->data[0] = '\0';
      pubkey->data[1] = '\0';
      pubkey->data[2] = '\0';
      pubkey->data[3] = '\0';
      pubkey->data[4] = '\0';
      pubkey->data[5] = '\0';
      pubkey->data[6] = '\0';
      pubkey->data[7] = '\0';
      pubkey->data[8] = '\0';
      pubkey->data[9] = '\0';
      pubkey->data[10] = '\0';
      pubkey->data[0xb] = '\0';
      pubkey->data[0xc] = '\0';
      pubkey->data[0xd] = '\0';
      pubkey->data[0xe] = '\0';
      pubkey->data[0xf] = '\0';
      return 0;
    }
    pcStack_bf0 = (code *)0x11ec05;
    bin = pubkey;
    secp256k1_ecdsa_recover_cold_2();
LAB_0011ec05:
    pcStack_bf0 = secp256k1_xonly_pubkey_parse;
    secp256k1_ecdsa_recover_cold_1();
    psStack_c00 = pubkey;
    pcStack_bf0 = (code *)uVar8;
    if (ctx == (secp256k1_context *)0x0) {
      secp256k1_xonly_pubkey_parse_cold_3();
    }
    else if (bin != (secp256k1_pubkey *)0x0) {
      bin->data[0x30] = '\0';
      bin->data[0x31] = '\0';
      bin->data[0x32] = '\0';
      bin->data[0x33] = '\0';
      bin->data[0x34] = '\0';
      bin->data[0x35] = '\0';
      bin->data[0x36] = '\0';
      bin->data[0x37] = '\0';
      bin->data[0x38] = '\0';
      bin->data[0x39] = '\0';
      bin->data[0x3a] = '\0';
      bin->data[0x3b] = '\0';
      bin->data[0x3c] = '\0';
      bin->data[0x3d] = '\0';
      bin->data[0x3e] = '\0';
      bin->data[0x3f] = '\0';
      bin->data[0x20] = '\0';
      bin->data[0x21] = '\0';
      bin->data[0x22] = '\0';
      bin->data[0x23] = '\0';
      bin->data[0x24] = '\0';
      bin->data[0x25] = '\0';
      bin->data[0x26] = '\0';
      bin->data[0x27] = '\0';
      bin->data[0x28] = '\0';
      bin->data[0x29] = '\0';
      bin->data[0x2a] = '\0';
      bin->data[0x2b] = '\0';
      bin->data[0x2c] = '\0';
      bin->data[0x2d] = '\0';
      bin->data[0x2e] = '\0';
      bin->data[0x2f] = '\0';
      bin->data[0x10] = '\0';
      bin->data[0x11] = '\0';
      bin->data[0x12] = '\0';
      bin->data[0x13] = '\0';
      bin->data[0x14] = '\0';
      bin->data[0x15] = '\0';
      bin->data[0x16] = '\0';
      bin->data[0x17] = '\0';
      bin->data[0x18] = '\0';
      bin->data[0x19] = '\0';
      bin->data[0x1a] = '\0';
      bin->data[0x1b] = '\0';
      bin->data[0x1c] = '\0';
      bin->data[0x1d] = '\0';
      bin->data[0x1e] = '\0';
      bin->data[0x1f] = '\0';
      bin->data[0] = '\0';
      bin->data[1] = '\0';
      bin->data[2] = '\0';
      bin->data[3] = '\0';
      bin->data[4] = '\0';
      bin->data[5] = '\0';
      bin->data[6] = '\0';
      bin->data[7] = '\0';
      bin->data[8] = '\0';
      bin->data[9] = '\0';
      bin->data[10] = '\0';
      bin->data[0xb] = '\0';
      bin->data[0xc] = '\0';
      bin->data[0xd] = '\0';
      bin->data[0xe] = '\0';
      bin->data[0xf] = '\0';
      if (a == (uchar *)0x0) {
        secp256k1_xonly_pubkey_parse_cold_1();
        return 0;
      }
      secp256k1_fe_impl_set_b32_mod(&sStack_c98,a);
      if (((0xffffefffffc2e < sStack_c98.n[0]) && (sStack_c98.n[4] == 0xffffffffffff)) &&
         ((sStack_c98.n[2] & sStack_c98.n[3] & sStack_c98.n[1]) == 0xfffffffffffff)) {
        return 0;
      }
      sStack_c98.magnitude = 1;
      sStack_c98.normalized = 1;
      secp256k1_fe_verify(&sStack_c98);
      iVar7 = secp256k1_ge_set_xo_var(&sStack_c68,&sStack_c98,0);
      if (iVar7 != 0) {
        secp256k1_ge_verify(&sStack_c68);
        secp256k1_ge_to_bytes(bin->data,&sStack_c68);
        return 1;
      }
      return 0;
    }
    secp256k1_xonly_pubkey_parse_cold_2();
    return 0;
  }
  pcStack_bf0 = (code *)0x11ebf0;
  secp256k1_ecdsa_recover_cold_5();
  return 0;
}

Assistant:

int secp256k1_ecdsa_recover(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const secp256k1_ecdsa_recoverable_signature *signature, const unsigned char *msghash32) {
    secp256k1_ge q;
    secp256k1_scalar r, s;
    secp256k1_scalar m;
    int recid;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(pubkey != NULL);

    secp256k1_ecdsa_recoverable_signature_load(ctx, &r, &s, &recid, signature);
    VERIFY_CHECK(recid >= 0 && recid < 4);  /* should have been caught in parse_compact */
    secp256k1_scalar_set_b32(&m, msghash32, NULL);
    if (secp256k1_ecdsa_sig_recover(&r, &s, &q, &m, recid)) {
        secp256k1_pubkey_save(pubkey, &q);
        return 1;
    } else {
        memset(pubkey, 0, sizeof(*pubkey));
        return 0;
    }
}